

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O1

int __thiscall
xercesc_4_0::AbstractNumericFacetValidator::init
          (AbstractNumericFacetValidator *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  int extraout_EAX;
  MemoryManager *in_RDX;
  
  this->fStrEnumeration = (RefArrayVectorOf<char16_t> *)ctx;
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    piVar1 = &(this->super_DatatypeValidator).fFacetsDefined;
    *(byte *)piVar1 = (byte)*piVar1 | 0x10;
  }
  assignFacet(this,in_RDX);
  inspectFacet(this,in_RDX);
  inspectFacetBase(this,in_RDX);
  inheritFacet(this);
  return extraout_EAX;
}

Assistant:

void AbstractNumericFacetValidator::init(RefArrayVectorOf<XMLCh>* const enums
                                         , MemoryManager* const manager)
{

    fStrEnumeration = enums; // save the literal value
	                         // which is needed for getEnumString()

    if (enums)
    {
        setFacetsDefined(DatatypeValidator::FACET_ENUMERATION);
    }

    assignFacet(manager);
    inspectFacet(manager);
    inspectFacetBase(manager);
    inheritFacet();
}